

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_abi_params(writer *w,method_signature *method_signature)

{
  bool bVar1;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *this;
  reference __in;
  type *this_00;
  TypeSig *pTVar2;
  RetTypeSig *pRVar3;
  TypeSig *in_RCX;
  void *__buf;
  string_view sVar4;
  string_view local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  string_view local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  TypeSig *local_118;
  TypeSig *type;
  char *local_108;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  ParamAttributes local_da;
  TypeSig *local_d8;
  anon_class_8_1_89897ddb_conflict2 local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  undefined1 local_b8 [16];
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  ParamAttributes local_92;
  undefined1 local_90 [8];
  string_view format;
  type *param_signature;
  type *param;
  __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
  local_68;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *__range1;
  separator s;
  member_value_guard<bool> abi_guard;
  method_signature *method_signature_local;
  writer *w_local;
  
  writer::push_abi_types((member_value_guard<bool> *)&s.first,w,true);
  s.w._0_1_ = 1;
  __range1 = (vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
              *)w;
  this = cppwinrt::method_signature::params(method_signature);
  __end1 = std::
           vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ::begin(this);
  local_68._M_current =
       (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
       std::
       vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
       ::end(this);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_68), bVar1) {
    __in = __gnu_cxx::
           __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
           ::operator*(&__end1);
    this_00 = ::std::get<0ul,winmd::reader::Param,winmd::reader::ParamSig_const*>(__in);
    format._M_str =
         (char *)::std::get<1ul,winmd::reader::Param,winmd::reader::ParamSig_const*>(__in);
    separator::operator()((separator *)&__range1);
    pTVar2 = winmd::reader::ParamSig::Type(*(ParamSig **)format._M_str);
    bVar1 = winmd::reader::TypeSig::is_szarray(pTVar2);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_90);
      local_92 = winmd::reader::Param::Flags(this_00);
      bVar1 = winmd::reader::ParamAttributes::In(&local_92);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,"uint32_t%, %");
        local_90 = (undefined1  [8])local_a8._M_len;
        format._M_len = (size_t)local_a8._M_str;
      }
      else {
        bVar1 = winmd::reader::ParamSig::ByRef(*(ParamSig **)format._M_str);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_b8,"uint32_t*%, %*");
          local_90 = (undefined1  [8])local_b8._0_8_;
          format._M_len = local_b8._8_8_;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_c8,"uint32_t%, %");
          local_90 = (undefined1  [8])local_c8._M_len;
          format._M_len = (size_t)local_c8._M_str;
        }
      }
      local_d0 = bind<&cppwinrt::write_array_size_name,_const_winmd::reader::Param_&>(this_00);
      pTVar2 = winmd::reader::ParamSig::Type(*(ParamSig **)format._M_str);
      local_d8 = (TypeSig *)
                 bind<&cppwinrt::write_abi_arg_out,_const_winmd::reader::TypeSig_&>(pTVar2);
      in_RCX = (TypeSig *)&local_d8;
      writer_base<cppwinrt::writer>::
      write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_90,&local_d0,
                 (anon_class_8_1_89897ddb_conflict3 *)in_RCX);
    }
    else {
      local_da = winmd::reader::Param::Flags(this_00);
      bVar1 = winmd::reader::ParamAttributes::In(&local_da);
      if (bVar1) {
        pTVar2 = winmd::reader::ParamSig::Type(*(ParamSig **)format._M_str);
        write_abi_arg_in(w,pTVar2);
        bVar1 = winmd::reader::is_const(*(ParamSig **)format._M_str);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_f0," const&");
          writer_base<cppwinrt::writer>::write
                    (&w->super_writer_base<cppwinrt::writer>,(int)&local_f0,__buf,(size_t)in_RCX);
        }
      }
      else {
        pTVar2 = winmd::reader::ParamSig::Type(*(ParamSig **)format._M_str);
        write_abi_arg_out(w,pTVar2);
      }
    }
    if ((w->param_names & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100," %");
      sVar4 = winmd::reader::Param::Name(this_00);
      local_108 = sVar4._M_str;
      in_RCX = (TypeSig *)sVar4._M_len;
      type = in_RCX;
      writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_100,
                 (basic_string_view<char,_std::char_traits<char>_> *)&type);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
    ::operator++(&__end1);
  }
  pRVar3 = cppwinrt::method_signature::return_signature(method_signature);
  bVar1 = winmd::reader::RetTypeSig::operator_cast_to_bool(pRVar3);
  if (bVar1) {
    separator::operator()((separator *)&__range1);
    pRVar3 = cppwinrt::method_signature::return_signature(method_signature);
    local_118 = winmd::reader::RetTypeSig::Type(pRVar3);
    bVar1 = winmd::reader::TypeSig::is_szarray(local_118);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_128,"uint32_t* __%Size, %**");
      local_138 = cppwinrt::method_signature::return_param_name(method_signature);
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
                (&w->super_writer_base<cppwinrt::writer>,&local_128,&local_138,local_118);
    }
    else {
      write_abi_arg_out(w,local_118);
    }
    if ((w->param_names & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148," %");
      local_158 = cppwinrt::method_signature::return_param_name(method_signature);
      writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_148,&local_158);
    }
  }
  writer::member_value_guard<bool>::~member_value_guard((member_value_guard<bool> *)&s.first);
  return;
}

Assistant:

static void write_abi_params(writer& w, method_signature const& method_signature)
    {
        auto abi_guard = w.push_abi_types(true);
        separator s{ w };

        for (auto&& [param, param_signature] : method_signature.params())
        {
            s();

            if (param_signature->Type().is_szarray())
            {
                std::string_view format;

                if (param.Flags().In())
                {
                    format = "uint32_t%, %";
                }
                else if (param_signature->ByRef())
                {
                    format = "uint32_t*%, %*";
                }
                else
                {
                    format = "uint32_t%, %";
                }

                w.write(format, bind<write_array_size_name>(param), bind<write_abi_arg_out>(param_signature->Type()));
            }
            else
            {
                if (param.Flags().In())
                {
                    write_abi_arg_in(w, param_signature->Type());

                    if (is_const(*param_signature))
                    {
                        w.write(" const&");
                    }
                }
                else
                {
                    write_abi_arg_out(w, param_signature->Type());
                }
            }

            if (w.param_names)
            {
                w.write(" %", param.Name());
            }
        }

        if (method_signature.return_signature())
        {
            s();

            auto const& type = method_signature.return_signature().Type();

            if (type.is_szarray())
            {
                w.write("uint32_t* __%Size, %**", method_signature.return_param_name(), type);
            }
            else
            {
                write_abi_arg_out(w, type);
            }

            if (w.param_names)
            {
                w.write(" %", method_signature.return_param_name());
            }
        }
    }